

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_init(nk_draw_list *list)

{
  long lVar1;
  float x;
  float fVar2;
  
  if (list != (nk_draw_list *)0x0) {
    nk_zero(list,0xf0);
    for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
      x = ((float)lVar1 / 12.0 + (float)lVar1 / 12.0) * 3.1415927;
      fVar2 = nk_cos(x);
      list->circle_vtx[lVar1].x = fVar2;
      list->circle_vtx[lVar1].y =
           ((((((x * 0.00013823564 + -0.0030399605) * x + 0.02080266) * x + -0.02673534) * x +
             -0.13807878) * x + -0.012127613) * x + 1.0008676) * x + 1.910593e-31;
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x2408,"void nk_draw_list_init(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_init(struct nk_draw_list *list)
{
    nk_size i = 0;
    NK_ASSERT(list);
    if (!list) return;
    nk_zero(list, sizeof(*list));
    for (i = 0; i < NK_LEN(list->circle_vtx); ++i) {
        const float a = ((float)i / (float)NK_LEN(list->circle_vtx)) * 2 * NK_PI;
        list->circle_vtx[i].x = (float)NK_COS(a);
        list->circle_vtx[i].y = (float)NK_SIN(a);
    }
}